

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte *pbVar2;
  char cVar3;
  uint *puVar4;
  char **ppcVar5;
  nullres nVar6;
  bool bVar7;
  uint uVar8;
  FILE *pFVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  FILE *pFVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  char *pcVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  char *pcVar25;
  char *pcVar26;
  char **ppcVar27;
  int iVar28;
  uint *bytecode;
  char tmp [256];
  char cmdLine [4096];
  uint *local_1460;
  char *local_1458;
  char *local_1450;
  char **local_1448;
  char *local_1440;
  char local_1438 [1024];
  undefined1 local_1038 [4];
  char acStack_1034 [9];
  char acStack_102b [4091];
  
  nullcInit();
  nullcAddImportPath("Modules/");
  if (argc == 1) {
    puts("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]");
    puts("usage: nullcl -c [-i import_folder] output.cpp file.nc");
    puts("usage: nullcl -x [-i import_folder] output.exe file.nc");
    return 1;
  }
  pbVar2 = (byte *)argv[1];
  uVar24 = *pbVar2 - 0x2d;
  if ((uVar24 == 0) && (uVar24 = pbVar2[1] - 0x76, uVar24 == 0)) {
    uVar24 = (uint)pbVar2[2];
  }
  uVar8 = (uint)(uVar24 == 0);
  uVar23 = uVar8 + 1;
  pcVar11 = (char *)(ulong)uVar23;
  pbVar2 = (byte *)argv[(long)pcVar11];
  bVar1 = *pbVar2;
  iVar28 = -(bVar1 - 0x2d);
  iVar22 = iVar28;
  if (bVar1 == 0x2d) {
    uVar21 = pbVar2[1] - 0x6f;
    if (uVar21 == 0) {
      uVar21 = (uint)pbVar2[2];
    }
    if (uVar21 != 0) {
      uVar21 = pbVar2[1] - 99;
      if (uVar21 == 0) {
        uVar21 = (uint)pbVar2[2];
      }
      iVar22 = -uVar21;
      goto LAB_00109b95;
    }
    uVar24 = uVar8 + 2;
    if (uVar24 != argc) {
      pFVar14 = fopen(argv[uVar24],"wb");
      if (pFVar14 != (FILE *)0x0) {
        pcVar11 = (char *)(ulong)(uVar8 + 3);
        goto LAB_00109bbf;
      }
      pcVar20 = argv[uVar24];
      pcVar11 = "Cannot create output file %s\n";
LAB_0010a30d:
      printf(pcVar11,pcVar20);
      goto LAB_0010a273;
    }
    pcVar11 = "Output file name not found after -o";
  }
  else {
LAB_00109b95:
    if (iVar22 != 0) {
      iVar22 = iVar28;
      if (bVar1 == 0x2d) {
        uVar21 = pbVar2[1] - 0x78;
        if (uVar21 == 0) {
          uVar21 = (uint)pbVar2[2];
        }
        iVar22 = -uVar21;
      }
      if (iVar22 != 0) {
        pFVar14 = (FILE *)0x0;
LAB_00109bbf:
        iVar22 = (int)pcVar11;
        ppcVar5 = argv;
        pcVar20 = pcVar11;
        pcVar25 = pcVar11;
        ppcVar27 = local_1448;
        pcVar26 = local_1440;
        do {
          local_1440 = pcVar25;
          local_1448 = ppcVar5;
          if (argc <= iVar22) {
LAB_0010a389:
            local_1440 = pcVar26;
            local_1448 = ppcVar27;
            if ((int)pcVar20 == (int)pcVar11) {
              puts("None of the input files were found");
            }
            if (pFVar14 != (FILE *)0x0) {
              fclose(pFVar14);
            }
            nullcTerminate();
            return (uint)((int)pcVar11 != argc);
          }
          uVar24 = (int)pcVar11 + 1;
          local_1458 = argv[(int)pcVar11];
          pFVar9 = fopen(local_1458,"rb");
          if (pFVar9 == (FILE *)0x0) {
            printf("Cannot open file %s\n",local_1458);
            pcVar11 = (char *)(ulong)uVar24;
            pcVar20 = local_1440;
            ppcVar27 = local_1448;
            pcVar26 = local_1440;
            goto LAB_0010a389;
          }
          local_1450 = pcVar11;
          fseek(pFVar9,0,2);
          uVar10 = ftell(pFVar9);
          fseek(pFVar9,0,0);
          pcVar11 = (char *)operator_new__((ulong)((int)uVar10 + 1));
          fread(pcVar11,1,uVar10 & 0xffffffff,pFVar9);
          pcVar11[uVar10 & 0xffffffff] = '\0';
          fclose(pFVar9);
          nVar6 = nullcCompile(pcVar11);
          if (nVar6 == '\0') {
            pcVar20 = nullcGetLastError();
            printf("Compilation of %s failed with error:\n%s\n",local_1458,pcVar20);
            operator_delete__(pcVar11);
            goto LAB_0010a273;
          }
          local_1460 = (uint *)0x0;
          nullcGetBytecode((char **)&local_1460);
          operator_delete__(pcVar11);
          pcVar20 = local_1440;
          pcVar26 = local_1458;
          pcVar11 = (char *)(ulong)uVar24;
          if ((int)uVar24 < argc) {
            pbVar2 = (byte *)local_1448[(int)uVar24];
            uVar24 = *pbVar2 - 0x2d;
            if ((uVar24 == 0) && (uVar24 = pbVar2[1] - 0x6d, uVar24 == 0)) {
              uVar24 = (uint)pbVar2[2];
            }
            if (uVar24 != 0) goto LAB_00109cd6;
            uVar24 = (int)local_1450 + 2;
            pcVar11 = (char *)(ulong)uVar24;
            if (uVar24 == argc) {
              puts("Module name not found after -m");
              pcVar11 = (char *)(ulong)(uint)argc;
              ppcVar27 = local_1448;
              pcVar26 = local_1440;
              if (local_1460 != (uint *)0x0) {
                operator_delete__(local_1460);
                pcVar11 = (char *)(ulong)(uint)argc;
                ppcVar27 = local_1448;
                pcVar26 = local_1440;
              }
              goto LAB_0010a389;
            }
            pcVar26 = local_1448[(int)uVar24];
            sVar12 = strlen(pcVar26);
            if (sVar12 - 0x3ff < 0xfffffffffffffc00) {
              pcVar26 = "Module name is too long";
              goto LAB_0010a320;
            }
            strcpy(local_1038,pcVar26);
            pcVar11 = (char *)(ulong)((int)local_1450 + 3);
            pcVar26 = local_1458;
          }
          else {
LAB_00109cd6:
            sVar12 = strlen(local_1458);
            if (sVar12 - 0x3ff < 0xfffffffffffffc00) {
              pcVar26 = "File name is too long";
LAB_0010a320:
              puts(pcVar26);
              ppcVar27 = local_1448;
              pcVar26 = local_1440;
              if (local_1460 != (uint *)0x0) {
                operator_delete__(local_1460);
                ppcVar27 = local_1448;
                pcVar26 = local_1440;
              }
              goto LAB_0010a389;
            }
            strcpy(local_1038,pcVar26);
            pcVar13 = strchr(local_1038,0x2e);
            pcVar25 = local_1038;
            cVar3 = local_1038[0];
            if (pcVar13 != (char *)0x0) {
              *pcVar13 = '\0';
            }
            while (cVar3 != '\0') {
              if (cVar3 == '\\') {
                pcVar13 = pcVar25 + 1;
LAB_00109d38:
                pcVar13[-1] = '.';
              }
              else {
                pcVar13 = pcVar25 + 2;
                if (pcVar25[1] == '/') goto LAB_00109d38;
              }
              pcVar25 = pcVar13;
              cVar3 = *pcVar13;
            }
          }
          nullcLoadModuleByBinary(local_1038,(char *)local_1460);
          if (pFVar14 == (FILE *)0x0) {
            sVar12 = strlen(pcVar26);
            if (sVar12 - 0x3fe < 0xfffffffffffffc01) {
              puts("File name is too long");
            }
            else {
              strcpy(local_1438,pcVar26);
              sVar12 = strlen(local_1438);
              (local_1438 + sVar12)[0] = 'm';
              (local_1438 + sVar12)[1] = '\0';
              pFVar9 = fopen(local_1438,"wb");
              if (pFVar9 != (FILE *)0x0) {
                sVar12 = strlen(local_1038);
                fwrite(local_1038,1,sVar12 + 1,pFVar9);
                fwrite(local_1460,1,(ulong)*local_1460,pFVar9);
                fclose(pFVar9);
                goto LAB_00109e18;
              }
              printf("Cannot create output file %s\n",local_1438);
            }
            ppcVar27 = local_1448;
            pcVar26 = local_1440;
            if (local_1460 != (uint *)0x0) {
              operator_delete__(local_1460);
              ppcVar27 = local_1448;
              pcVar26 = local_1440;
            }
            goto LAB_0010a389;
          }
          sVar12 = strlen(local_1038);
          fwrite(local_1038,1,sVar12 + 1,pFVar14);
          fwrite(local_1460,1,(ulong)*local_1460,pFVar14);
LAB_00109e18:
          argv = local_1448;
          if (local_1460 != (uint *)0x0) {
            operator_delete__(local_1460);
          }
          iVar22 = (int)pcVar11;
          ppcVar5 = local_1448;
          pcVar25 = local_1440;
          ppcVar27 = local_1448;
          pcVar26 = local_1440;
        } while( true );
      }
    }
    if (bVar1 == 0x2d) {
      uVar21 = pbVar2[1] - 0x78;
      if (uVar21 == 0) {
        uVar21 = (uint)pbVar2[2];
      }
      iVar28 = -uVar21;
    }
    uVar8 = uVar8 + 2;
    if ((int)uVar8 < argc) {
      do {
        iVar22 = (int)pcVar11;
        pbVar2 = (byte *)argv[iVar22 + 1];
        uVar8 = *pbVar2 - 0x2d;
        if ((uVar8 == 0) && (uVar8 = pbVar2[1] - 0x69, uVar8 == 0)) {
          uVar8 = (uint)pbVar2[2];
        }
        if (uVar8 != 0) break;
        if ((char *)((ulong)(uint)argc - 2) == pcVar11) {
          pcVar11 = "Missing folder name after -i";
          goto LAB_0010a26e;
        }
        pcVar20 = pcVar11 + 2;
        pcVar11 = pcVar11 + 2;
        nullcAddImportPath(argv[(long)pcVar20]);
      } while (iVar22 + 3 < argc);
      uVar23 = (uint)pcVar11;
      uVar8 = uVar23 + 1;
    }
    if (uVar8 == argc) {
      pcVar11 = "Output file name not found after options";
    }
    else {
      if (uVar23 + 2 != argc) {
        pcVar11 = argv[uVar8];
        pcVar20 = argv[uVar23 + 2];
        pFVar14 = fopen(pcVar20,"rb");
        if (pFVar14 != (FILE *)0x0) {
          local_1458 = pcVar11;
          fseek(pFVar14,0,2);
          uVar10 = ftell(pFVar14);
          fseek(pFVar14,0,0);
          pcVar26 = (char *)operator_new__((ulong)((int)uVar10 + 1));
          fread(pcVar26,1,uVar10 & 0xffffffff,pFVar14);
          pcVar26[uVar10 & 0xffffffff] = '\0';
          fclose(pFVar14);
          nVar6 = nullcCompile(pcVar26);
          pcVar11 = local_1458;
          if (nVar6 != '\0') {
            pcVar25 = "__temp.cpp";
            if (iVar28 != 0) {
              pcVar25 = local_1458;
            }
            nVar6 = nullcTranslateToC(pcVar25,"main",AddDependency);
            if (nVar6 != '\0') {
              if (iVar28 == 0) {
                local_1038[0] = 'g';
                stack0xffffffffffffefc9 = 0x20672d206363;
                builtin_strncpy(acStack_1034 + 3,"-o ",4);
                local_1450 = pcVar26;
                sVar12 = strlen(local_1038);
                pcVar20 = local_1038 + sVar12;
                strcpy(pcVar20,pcVar11);
                sVar15 = strlen(pcVar20);
                pcVar20 = pcVar20 + sVar15;
                builtin_strncpy(local_1038 + sVar15 + sVar12," __temp.cpp",0xc);
                sVar16 = strlen(pcVar20);
                pcVar20 = pcVar20 + sVar16;
                builtin_strncpy(local_1038 + sVar16 + sVar15 + sVar12," -Itranslation",0xf);
                sVar17 = strlen(pcVar20);
                pcVar20 = pcVar20 + sVar17;
                builtin_strncpy(local_1038 + sVar17 + sVar16 + sVar15 + sVar12,
                                " -INULLC/translation",0x15);
                sVar18 = strlen(pcVar20);
                pcVar20 = pcVar20 + sVar18;
                builtin_strncpy(local_1038 + sVar18 + sVar17 + sVar16 + sVar15 + sVar12,
                                " -I../NULLC/translation",0x18);
                sVar19 = strlen(pcVar20);
                builtin_strncpy(local_1038 + sVar19 + sVar18 + sVar17 + sVar16 + sVar15 + sVar12,
                                " -O2",5);
                sVar12 = strlen(pcVar20 + sVar19);
                local_1460 = (uint *)(pcVar20 + sVar19 + sVar12);
                bVar7 = SearchAndAddSourceFile((char **)&local_1460,"runtime.cpp");
                if (!bVar7) {
                  puts("Failed to find \'runtime.cpp\' input file");
                }
                if (translationDependencyCount != 0) {
                  ppcVar27 = translationDependencies;
                  uVar10 = 0;
                  do {
                    puVar4 = local_1460;
                    pcVar20 = *ppcVar27;
                    pcVar11 = (char *)((long)local_1460 + 1);
                    *(char *)local_1460 = ' ';
                    strcpy(pcVar11,pcVar20);
                    sVar12 = strlen(pcVar11);
                    local_1460 = (uint *)((long)puVar4 + sVar12 + 1);
                    pcVar11 = strstr(pcVar20,"import_");
                    if (pcVar11 != (char *)0x0) {
                      format(local_1438,0x100,"%s",pcVar20 + 7);
                      pcVar11 = strstr(local_1438,"_nc.cpp");
                      if (pcVar11 != (char *)0x0) {
                        builtin_strncpy(pcVar11,"_bind.cpp",10);
                      }
                      bVar7 = SearchAndAddSourceFile((char **)&local_1460,local_1438);
                      if (!bVar7) {
                        printf("Failed to find \'%s\' input file\n",local_1438);
                      }
                    }
                    uVar10 = uVar10 + 1;
                    ppcVar27 = ppcVar27 + 1;
                  } while (uVar10 < translationDependencyCount);
                }
                builtin_strncpy((char *)((long)local_1460 + 6),"c++ -lm",8);
                local_1460[0] = 0x736c2d20;
                local_1460[1] = 0x2b636474;
                if (uVar24 == 0) {
                  printf("Command line: %s\n",local_1038);
                }
                system(local_1038);
                pcVar26 = local_1450;
              }
              operator_delete__(pcVar26);
              nullcTerminate();
              return 0;
            }
          }
          pcVar11 = nullcGetLastError();
          printf("Compilation of %s failed with error:\n%s\n",pcVar20,pcVar11);
          operator_delete__(pcVar26);
          return 1;
        }
        pcVar11 = "Cannot open file %s\n";
        goto LAB_0010a30d;
      }
      pcVar11 = "Input file name not found after output file name";
    }
  }
LAB_0010a26e:
  puts(pcVar11);
LAB_0010a273:
  nullcTerminate();
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
	nullcInit();
	nullcAddImportPath("Modules/");

	if(argc == 1)
	{
		printf("usage: nullcl [-o output.ncm] file.nc [-m module.name] [file2.nc [-m module.name] ...]\n");
		printf("usage: nullcl -c [-i import_folder] output.cpp file.nc\n");
		printf("usage: nullcl -x [-i import_folder] output.exe file.nc\n");
		return 1;
	}

	int argIndex = 1;
	FILE *mergeFile = NULL;
	bool verbose = false;

	if(strcmp("-v", argv[argIndex]) == 0)
	{
		argIndex++;

		verbose = true;
	}

	if(strcmp("-o", argv[argIndex]) == 0)
	{
		argIndex++;
		if(argIndex == argc)
		{
			printf("Output file name not found after -o\n");
			nullcTerminate();
			return 1;
		}
		mergeFile = fopen(argv[argIndex], "wb");
		if(!mergeFile)
		{
			printf("Cannot create output file %s\n", argv[argIndex]);
			nullcTerminate();
			return 1;
		}
		argIndex++;
	}else if(strcmp("-c", argv[argIndex]) == 0 || strcmp("-x", argv[argIndex]) == 0){
		bool link = strcmp("-x", argv[argIndex]) == 0;
		argIndex++;

		while(argIndex < argc && strcmp("-i", argv[argIndex]) == 0)
		{
			argIndex++;

			if(argIndex == argc)
			{
				printf("Missing folder name after -i\n");
				nullcTerminate();
				return 1;
			}

			const char* folder = argv[argIndex++];
			nullcAddImportPath(folder);
		}

		if(argIndex == argc)
		{
			printf("Output file name not found after options\n");
			nullcTerminate();
			return 1;
		}

		const char *outputName = argv[argIndex++];

		if(argIndex == argc)
		{
			printf("Input file name not found after output file name\n");
			nullcTerminate();
			return 1;
		}

		const char *fileName = argv[argIndex++];
		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			nullcTerminate();
			return 1;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(!nullcTranslateToC(link ? "__temp.cpp" : outputName, "main", AddDependency))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			return 1;
		}

		if(link)
		{
			// $$$ move this to a dependency file?
			char cmdLine[4096];

			char *pos = cmdLine;
			strcpy(pos, "gcc -g -o ");
			pos += strlen(pos);

			strcpy(pos, outputName);
			pos += strlen(pos);

			strcpy(pos, " __temp.cpp");
			pos += strlen(pos);

			strcpy(pos, " -Itranslation");
			pos += strlen(pos);

			strcpy(pos, " -INULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -I../NULLC/translation");
			pos += strlen(pos);

			strcpy(pos, " -O2");
			pos += strlen(pos);

			if(!SearchAndAddSourceFile(pos, "runtime.cpp"))
				printf("Failed to find 'runtime.cpp' input file\n");

			for(unsigned i = 0; i < translationDependencyCount; i++)
			{
				const char *dependency = translationDependencies[i];

				*(pos++) = ' ';

				strcpy(pos, dependency);
				pos += strlen(pos);

				if(strstr(dependency, "import_"))
				{
					char tmp[256];
					format(tmp, 256, "%s", dependency + strlen("import_"));

					if(char *pos = strstr(tmp, "_nc.cpp"))
						strcpy(pos, "_bind.cpp");

					if(!SearchAndAddSourceFile(pos, tmp))
						printf("Failed to find '%s' input file\n", tmp);
				}
			}

			strcpy(pos, " -lstdc++ -lm");
			pos += strlen(pos);

			if (verbose)
				printf("Command line: %s\n", cmdLine);

			system(cmdLine);
		}
		delete[] fileContent;
		nullcTerminate();
		return 0;
	}
	int currIndex = argIndex;
	while(argIndex < argc)
	{
		const char *fileName = argv[argIndex++];

		FILE *ncFile = fopen(fileName, "rb");
		if(!ncFile)
		{
			printf("Cannot open file %s\n", fileName);
			break;
		}

		fseek(ncFile, 0, SEEK_END);
		unsigned int textSize = ftell(ncFile);
		fseek(ncFile, 0, SEEK_SET);
		char *fileContent = new char[textSize+1];
		fread(fileContent, 1, textSize, ncFile);
		fileContent[textSize] = 0;
		fclose(ncFile);

		if(!nullcCompile(fileContent))
		{
			printf("Compilation of %s failed with error:\n%s\n", fileName, nullcGetLastError());
			delete[] fileContent;
			nullcTerminate();
			return 1;
		}
		unsigned int *bytecode = NULL;
		nullcGetBytecode((char**)&bytecode);
		delete[] fileContent;

		// Create module name
		char	moduleName[1024];
		if(argIndex < argc && strcmp("-m", argv[argIndex]) == 0)
		{
			argIndex++;
			if(argIndex == argc)
			{
				printf("Module name not found after -m\n");

				delete[] bytecode;
				break;
			}

			if(strlen(argv[argIndex]) + 1 >= 1024)
			{
				printf("Module name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, argv[argIndex]);

			argIndex++;
		}
		else
		{
			if(strlen(fileName) + 1 >= 1024)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(moduleName, fileName);
			if(char *extensionPos = strchr(moduleName, '.'))
				*extensionPos = '\0';
			char	*pos = moduleName;
			while(*pos)
			{
				if(*pos++ == '\\' || *pos++ == '/')
					pos[-1] = '.';
			}
		}
		nullcLoadModuleByBinary(moduleName, (const char*)bytecode);

		if(!mergeFile)
		{
			char newName[1024];

			// Ont extra character for 'm' appended at the end
			if(strlen(fileName) + 1 >= 1024 - 1)
			{
				printf("File name is too long\n");

				delete[] bytecode;
				break;
			}

			strcpy(newName, fileName);
			strcat(newName, "m");
			FILE *nmcFile = fopen(newName, "wb");
			if(!nmcFile)
			{
				printf("Cannot create output file %s\n", newName);

				delete[] bytecode;
				break;
			}
			fwrite(moduleName, 1, strlen(moduleName) + 1, nmcFile);
			fwrite(bytecode, 1, *bytecode, nmcFile);
			fclose(nmcFile);
		}else{
			fwrite(moduleName, 1, strlen(moduleName) + 1, mergeFile);
			fwrite(bytecode, 1, *bytecode, mergeFile);
		}

		delete[] bytecode;
	}
	if(currIndex == argIndex)
		printf("None of the input files were found\n");

	if(mergeFile)
		fclose(mergeFile);

	nullcTerminate();

	return argIndex != argc;	
}